

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

void __thiscall QAbstractItemView::editorDestroyed(QAbstractItemView *this,QObject *editor)

{
  QAbstractItemViewPrivate *this_00;
  QAbstractItemViewPrivate *d;
  long in_FS_OFFSET;
  QWidget *w;
  QWidget *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  if (editor == (QObject *)0x0) {
    local_28 = (QWidget *)0x0;
  }
  else {
    local_28 = (QWidget *)0x0;
    if ((*(byte *)(*(long *)(editor + 8) + 0x30) & 1) != 0) {
      local_28 = (QWidget *)editor;
    }
  }
  QAbstractItemViewPrivate::removeEditor(this_00,local_28);
  QHash<QWidget*,QHashDummyValue>::removeImpl<QWidget*>
            ((QHash<QWidget*,QHashDummyValue> *)&this_00->persistent,&local_28);
  if (*(int *)(*(long *)(this + 8) + 0x3a8) == 3) {
    *(undefined4 *)(*(long *)(this + 8) + 0x3a8) = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::editorDestroyed(QObject *editor)
{
    Q_D(QAbstractItemView);
    QWidget *w = qobject_cast<QWidget*>(editor);
    d->removeEditor(w);
    d->persistent.remove(w);
    if (state() == EditingState)
        setState(NoState);
}